

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

ChStreamInAscii * __thiscall chrono::ChStreamInAscii::operator>>(ChStreamInAscii *this,string *str)

{
  int iVar1;
  bool bVar2;
  char loa [2];
  
  loa[1] = '\0';
  std::__cxx11::string::assign((char *)str);
  bVar2 = false;
LAB_00a372da:
  do {
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,loa,1);
    iVar1 = (*(this->super_ChStreamIn)._vptr_ChStreamIn[2])(this);
    if ((char)iVar1 != '\0') {
      return this;
    }
    if (((byte)loa[0] - 9 < 2) || (loa[0] == ' ')) {
      if (!bVar2) {
        bVar2 = false;
        goto LAB_00a372da;
      }
      if (((byte)loa[0] < 0x21) && ((0x100000601U >> ((ulong)(byte)loa[0] & 0x3f) & 1) != 0)) {
        return this;
      }
    }
    else if (loa[0] == '\0') {
      return this;
    }
    std::__cxx11::string::append((char *)str);
    bVar2 = true;
  } while( true );
}

Assistant:

ChStreamInAscii& ChStreamInAscii::operator>>(std::string& str) {
    // bool stop = 0; //unused
    int cnt = 0;
    char loa[2];
    loa[1] = 0;
    str = "";
    bool started = false;

    while (true) {
        try {
            Input(loa, 1);
        } catch (const std::exception&) {
            if (!(this->End_of_stream() && cnt > 0))
                throw(ChException("Cannot read from stream"));
        }

        if (this->End_of_stream())
            break;

        if (loa[0] != *"\n" && loa[0] != *" " && loa[0] != *"\t")
            started = true;

        if (started) {
            if (loa[0] == *"\n" || loa[0] == *" " || loa[0] == *"\t" || loa[0] == 0)
                break;
            str.append(loa);
        }

        cnt++;
    }

    return *this;
}